

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O2

void duckdb::WriteQuotedString
               (WriteStream *writer,WriteCSVData *csv_data,char *str,idx_t len,bool force_quote)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this;
  byte *pbVar1;
  char *pcVar2;
  char cVar3;
  char escape;
  int iVar4;
  reference pvVar5;
  idx_t iVar6;
  undefined3 in_register_00000081;
  string new_val;
  string local_68;
  string local_48;
  
  if (CONCAT31(in_register_00000081,force_quote) == 0) {
    this = &(csv_data->super_BaseCSVData).options.null_str;
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(this,0);
    if (pvVar5->_M_string_length == len) {
      pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(this,0);
      iVar4 = bcmp(str,(pvVar5->_M_dataplus)._M_p,len);
      if (iVar4 == 0) goto LAB_015a5c43;
    }
    iVar6 = 0;
    do {
      if (len == iVar6) goto LAB_015a5d32;
      pbVar1 = (byte *)(str + iVar6);
      iVar6 = iVar6 + 1;
    } while ((csv_data->requires_quotes).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t
             .super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
             super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
             super__Head_base<0UL,_bool_*,_false>._M_head_impl[*pbVar1] != true);
  }
LAB_015a5c43:
  cVar3 = (csv_data->super_BaseCSVData).options.dialect_options.state_machine_options.quote.value;
  if (cVar3 != '\0') {
    iVar6 = 0;
    do {
      if (len == iVar6) {
        WriteQuoteOrEscape(writer,cVar3);
        (**writer->_vptr_WriteStream)(writer,str,len);
        WriteQuoteOrEscape(writer,(csv_data->super_BaseCSVData).options.dialect_options.
                                  state_machine_options.quote.value);
        return;
      }
      pcVar2 = str + iVar6;
    } while ((*pcVar2 != cVar3) &&
            (iVar6 = iVar6 + 1,
            *pcVar2 !=
            (csv_data->super_BaseCSVData).options.dialect_options.state_machine_options.escape.value
            ));
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,str,str + len);
    cVar3 = (csv_data->super_BaseCSVData).options.dialect_options.state_machine_options.escape.value
    ;
    AddEscapes(&local_48,cVar3,cVar3,&local_68);
    ::std::__cxx11::string::operator=((string *)&local_68,(string *)&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
    cVar3 = (csv_data->super_BaseCSVData).options.dialect_options.state_machine_options.quote.value;
    escape = (csv_data->super_BaseCSVData).options.dialect_options.state_machine_options.escape.
             value;
    if (escape != cVar3) {
      AddEscapes(&local_48,cVar3,escape,&local_68);
      ::std::__cxx11::string::operator=((string *)&local_68,(string *)&local_48);
      ::std::__cxx11::string::~string((string *)&local_48);
      escape = (csv_data->super_BaseCSVData).options.dialect_options.state_machine_options.quote.
               value;
    }
    WriteQuoteOrEscape(writer,escape);
    (**writer->_vptr_WriteStream)(writer,local_68._M_dataplus._M_p,local_68._M_string_length);
    WriteQuoteOrEscape(writer,(csv_data->super_BaseCSVData).options.dialect_options.
                              state_machine_options.quote.value);
    ::std::__cxx11::string::~string((string *)&local_68);
    return;
  }
LAB_015a5d32:
  (**writer->_vptr_WriteStream)(writer,str,len);
  return;
}

Assistant:

static void WriteQuotedString(WriteStream &writer, WriteCSVData &csv_data, const char *str, idx_t len,
                              bool force_quote) {
	auto &options = csv_data.options;
	if (!force_quote) {
		// force quote is disabled: check if we need to add quotes anyway
		force_quote = RequiresQuotes(csv_data, str, len);
	}
	// If a quote is set to none (i.e., null-terminator) we skip the quotation
	if (force_quote && options.dialect_options.state_machine_options.quote.GetValue() != '\0') {
		// quoting is enabled: we might need to escape things in the string
		bool requires_escape = false;
		// simple CSV
		// do a single loop to check for a quote or escape value
		for (idx_t i = 0; i < len; i++) {
			if (str[i] == options.dialect_options.state_machine_options.quote.GetValue() ||
			    str[i] == options.dialect_options.state_machine_options.escape.GetValue()) {
				requires_escape = true;
				break;
			}
		}

		if (!requires_escape) {
			// fast path: no need to escape anything
			WriteQuoteOrEscape(writer, options.dialect_options.state_machine_options.quote.GetValue());
			writer.WriteData(const_data_ptr_cast(str), len);
			WriteQuoteOrEscape(writer, options.dialect_options.state_machine_options.quote.GetValue());
			return;
		}

		// slow path: need to add escapes
		string new_val(str, len);
		new_val = AddEscapes(options.dialect_options.state_machine_options.escape.GetValue(),
		                     options.dialect_options.state_machine_options.escape.GetValue(), new_val);
		if (options.dialect_options.state_machine_options.escape !=
		    options.dialect_options.state_machine_options.quote) {
			// need to escape quotes separately
			new_val = AddEscapes(options.dialect_options.state_machine_options.quote.GetValue(),
			                     options.dialect_options.state_machine_options.escape.GetValue(), new_val);
		}
		WriteQuoteOrEscape(writer, options.dialect_options.state_machine_options.quote.GetValue());
		writer.WriteData(const_data_ptr_cast(new_val.c_str()), new_val.size());
		WriteQuoteOrEscape(writer, options.dialect_options.state_machine_options.quote.GetValue());
	} else {
		writer.WriteData(const_data_ptr_cast(str), len);
	}
}